

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcCom.c
# Opt level: O0

int Abc_CommandPdrAbs(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  int c;
  Wlc_Par_t *pPars;
  Wlc_Par_t Pars;
  Wlc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  Pars.pFuncStop = (_func_int_int *)Wlc_AbcGetNtk(pAbc);
  Wlc_ManSetDefaultParams((Wlc_Par_t *)&pPars);
  Extra_UtilGetoptReset();
LAB_003e58a4:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"AMXFILabrcdilpqmstuxvwh");
    if (iVar1 == -1) {
      if (Pars.pFuncStop == (_func_int_int *)0x0) {
        Abc_Print(1,"Abc_CommandCone(): There is no current design.\n");
        return 0;
      }
      Wlc_NtkPdrAbs((Wlc_Ntk_t *)Pars.pFuncStop,(Wlc_Par_t *)&pPars);
      return 0;
    }
    switch(iVar1) {
    case 0x41:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-A\" should be followed by an integer.\n");
        goto LAB_003e5d3a;
      }
      pPars._0_4_ = atoi(argv[globalUtilOptind]);
      uVar2 = (uint)pPars;
      break;
    default:
      goto LAB_003e5d3a;
    case 0x46:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
        goto LAB_003e5d3a;
      }
      Pars.nBitsMul = atoi(argv[globalUtilOptind]);
      uVar2 = Pars.nBitsMul;
      break;
    case 0x49:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-I\" should be followed by an integer.\n");
        goto LAB_003e5d3a;
      }
      Pars.nBitsMux = atoi(argv[globalUtilOptind]);
      uVar2 = Pars.nBitsMux;
      break;
    case 0x4c:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-L\" should be followed by an integer.\n");
        goto LAB_003e5d3a;
      }
      Pars.nBitsFlop = atoi(argv[globalUtilOptind]);
      uVar2 = Pars.nBitsFlop;
      break;
    case 0x4d:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-M\" should be followed by an integer.\n");
        goto LAB_003e5d3a;
      }
      pPars._4_4_ = atoi(argv[globalUtilOptind]);
      uVar2 = pPars._4_4_;
      break;
    case 0x58:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-X\" should be followed by an integer.\n");
        goto LAB_003e5d3a;
      }
      Pars.nBitsAdd = atoi(argv[globalUtilOptind]);
      uVar2 = Pars.nBitsAdd;
      break;
    case 0x61:
      Pars.fPushClauses = Pars.fPushClauses ^ 1;
      goto LAB_003e58a4;
    case 0x62:
      Pars.fPdra = Pars.fPdra ^ 1;
      goto LAB_003e58a4;
    case 99:
      Pars.nLimit = Pars.nLimit ^ 1;
      goto LAB_003e58a4;
    case 100:
      Pars.fHybrid = Pars.fHybrid ^ 1;
      goto LAB_003e58a4;
    case 0x68:
      goto LAB_003e5d3a;
    case 0x69:
      Pars.fCheckCombUnsat = Pars.fCheckCombUnsat ^ 1;
      goto LAB_003e58a4;
    case 0x6c:
      Pars.fMFFC = Pars.fMFFC ^ 1;
      goto LAB_003e58a4;
    case 0x6d:
      Pars.fCheckClauses = Pars.fCheckClauses ^ 1;
      goto LAB_003e58a4;
    case 0x70:
      Pars.fXorOutput = Pars.fXorOutput ^ 1;
      goto LAB_003e58a4;
    case 0x71:
      Pars.fAbs2 = Pars.fAbs2 ^ 1;
      goto LAB_003e58a4;
    case 0x72:
      Pars.fLoadTrace = Pars.fLoadTrace ^ 1;
      goto LAB_003e58a4;
    case 0x73:
      Pars.fProofUsePPI = Pars.fProofUsePPI ^ 1;
      goto LAB_003e58a4;
    case 0x74:
      Pars.fUseBmc3 = Pars.fUseBmc3 ^ 1;
      goto LAB_003e58a4;
    case 0x75:
      Pars.fProofRefine = Pars.fProofRefine ^ 1;
      goto LAB_003e58a4;
    case 0x76:
      Pars.fShrinkAbs = Pars.fShrinkAbs ^ 1;
      goto LAB_003e58a4;
    case 0x77:
      Pars.fShrinkScratch = Pars.fShrinkScratch ^ 1;
      goto LAB_003e58a4;
    case 0x78:
      Pars.nIterMax = Pars.nIterMax ^ 1;
      goto LAB_003e58a4;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if ((int)uVar2 < 0) {
LAB_003e5d3a:
      Abc_Print(-2,"usage: %%pdra [-AMXFIL num] [-abrcdilpqmxstuvwh]\n");
      Abc_Print(-2,"\t         abstraction for word-level networks\n");
      Abc_Print(-2,
                "\t-A num : minimum bit-width of an adder/subtractor to abstract [default = %d]\n",
                (ulong)(uint)pPars);
      Abc_Print(-2,"\t-M num : minimum bit-width of a multiplier to abstract [default = %d]\n",
                (ulong)pPars._4_4_);
      Abc_Print(-2,"\t-X num : minimum bit-width of a MUX operator to abstract [default = %d]\n",
                (ulong)(uint)Pars.nBitsAdd);
      Abc_Print(-2,"\t-F num : minimum bit-width of a flip-flop to abstract [default = %d]\n",
                (ulong)(uint)Pars.nBitsMul);
      Abc_Print(-2,"\t-I num : maximum number of CEGAR iterations [default = %d]\n",
                (ulong)(uint)Pars.nBitsMux);
      Abc_Print(-2,"\t-L num : maximum number of each type of signals [default = %d]\n",
                (ulong)(uint)Pars.nBitsFlop);
      pcVar3 = "no";
      if (Pars.nIterMax != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-x     : toggle XORing outputs of word-level miter [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (Pars.fPushClauses != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-a     : toggle running pdr with -nct [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (Pars.fPdra != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-b     : toggle using proof-based refinement [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (Pars.fLoadTrace != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,
                "\t-r     : toggle using both cex-based and proof-based refinement [default = %s]\n"
                ,pcVar3);
      pcVar3 = "no";
      if (Pars.nLimit != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-c     : toggle checking clauses in the reloaded trace [default = %s]\n",
                pcVar3);
      pcVar3 = "no";
      if (Pars.fHybrid != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-d     : toggle using another way of creating abstractions [default = %s]\n",
                pcVar3);
      pcVar3 = "no";
      if (Pars.fCheckCombUnsat != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-i     : toggle using PPI values in proof-based refinement [default = %s]\n",
                pcVar3);
      pcVar3 = "no";
      if (Pars.fMFFC != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-l     : toggle loading previous PDR traces [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (Pars.fProofUsePPI != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-s     : toggle shrinking abstractions with BMC [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (Pars.fUseBmc3 != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,
                "\t-t     : toggle restarting pdr from scratch after shrinking abstractions with BMC [default = %s]\n"
                ,pcVar3);
      pcVar3 = "no";
      if (Pars.fProofRefine != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-u     : toggle checking combinationally unsat [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (Pars.fXorOutput != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-p     : toggle pushing clauses in the reloaded trace [default = %s]\n",pcVar3
               );
      pcVar3 = "no";
      if (Pars.fAbs2 != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-q     : toggle running bmc3 in parallel for CEX [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (Pars.fCheckClauses != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-m     : toggle refining the whole MFFC of a PPI [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (Pars.fShrinkAbs != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (Pars.fShrinkScratch != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-w     : toggle printing verbose PDR output [default = %s]\n",pcVar3);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandPdrAbs( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Wlc_Ntk_t * pNtk = Wlc_AbcGetNtk(pAbc);
    Wlc_Par_t Pars, * pPars = &Pars;
    int c;
    Wlc_ManSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "AMXFILabrcdilpqmstuxvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBitsAdd = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBitsAdd < 0 )
                goto usage;
            break;
        case 'M':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-M\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBitsMul = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBitsMul < 0 )
                goto usage;
            break;
        case 'X':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-X\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBitsMux = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBitsMux < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBitsFlop = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBitsFlop < 0 )
                goto usage;
            break;
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nIterMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nIterMax < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLimit < 0 )
                goto usage;
            break;
        case 'a':
            pPars->fPdra ^= 1;
            break;
        case 'b':
            pPars->fProofRefine ^= 1;
            break;
        case 'r':
            pPars->fHybrid ^= 1;
            break;
        case 'x':
            pPars->fXorOutput ^= 1;
            break;
        case 'c':
            pPars->fCheckClauses ^= 1;
            break;
        case 'd':
            pPars->fAbs2 ^= 1;
            break;
        case 'i':
            pPars->fProofUsePPI ^= 1;
            break;
        case 'l':
            pPars->fLoadTrace ^= 1;
            break;
        case 'p':
            pPars->fPushClauses ^= 1;
            break;
        case 'q':
            pPars->fUseBmc3 ^= 1;
            break;
        case 'm':
            pPars->fMFFC ^= 1;
            break;
        case 's':
            pPars->fShrinkAbs ^= 1;
            break;
        case 't':
            pPars->fShrinkScratch ^= 1;
            break;
        case 'u':
            pPars->fCheckCombUnsat ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fPdrVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( 1, "Abc_CommandCone(): There is no current design.\n" );
        return 0;
    }
    Wlc_NtkPdrAbs( pNtk, pPars );
    return 0;
usage:
    Abc_Print( -2, "usage: %%pdra [-AMXFIL num] [-abrcdilpqmxstuvwh]\n" );
    Abc_Print( -2, "\t         abstraction for word-level networks\n" );
    Abc_Print( -2, "\t-A num : minimum bit-width of an adder/subtractor to abstract [default = %d]\n", pPars->nBitsAdd );
    Abc_Print( -2, "\t-M num : minimum bit-width of a multiplier to abstract [default = %d]\n",        pPars->nBitsMul );
    Abc_Print( -2, "\t-X num : minimum bit-width of a MUX operator to abstract [default = %d]\n",      pPars->nBitsMux );
    Abc_Print( -2, "\t-F num : minimum bit-width of a flip-flop to abstract [default = %d]\n",         pPars->nBitsFlop );
    Abc_Print( -2, "\t-I num : maximum number of CEGAR iterations [default = %d]\n",                   pPars->nIterMax );
    Abc_Print( -2, "\t-L num : maximum number of each type of signals [default = %d]\n",               pPars->nLimit );
    Abc_Print( -2, "\t-x     : toggle XORing outputs of word-level miter [default = %s]\n",            pPars->fXorOutput? "yes": "no" );
    Abc_Print( -2, "\t-a     : toggle running pdr with -nct [default = %s]\n",                         pPars->fPdra? "yes": "no" );
    Abc_Print( -2, "\t-b     : toggle using proof-based refinement [default = %s]\n",                  pPars->fProofRefine? "yes": "no" );
    Abc_Print( -2, "\t-r     : toggle using both cex-based and proof-based refinement [default = %s]\n",                  pPars->fHybrid? "yes": "no" );
    Abc_Print( -2, "\t-c     : toggle checking clauses in the reloaded trace [default = %s]\n",        pPars->fCheckClauses? "yes": "no" );
    Abc_Print( -2, "\t-d     : toggle using another way of creating abstractions [default = %s]\n",    pPars->fAbs2? "yes": "no" );
    Abc_Print( -2, "\t-i     : toggle using PPI values in proof-based refinement [default = %s]\n",    pPars->fProofUsePPI? "yes": "no" );
    Abc_Print( -2, "\t-l     : toggle loading previous PDR traces [default = %s]\n",                   pPars->fLoadTrace? "yes": "no" );
    Abc_Print( -2, "\t-s     : toggle shrinking abstractions with BMC [default = %s]\n",               pPars->fShrinkAbs? "yes": "no" );
    Abc_Print( -2, "\t-t     : toggle restarting pdr from scratch after shrinking abstractions with BMC [default = %s]\n",               pPars->fShrinkScratch? "yes": "no" );
    Abc_Print( -2, "\t-u     : toggle checking combinationally unsat [default = %s]\n",                pPars->fCheckCombUnsat? "yes": "no" );
    Abc_Print( -2, "\t-p     : toggle pushing clauses in the reloaded trace [default = %s]\n",         pPars->fPushClauses? "yes": "no" );
    Abc_Print( -2, "\t-q     : toggle running bmc3 in parallel for CEX [default = %s]\n",              pPars->fUseBmc3? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggle refining the whole MFFC of a PPI [default = %s]\n",              pPars->fMFFC? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n",                  pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w     : toggle printing verbose PDR output [default = %s]\n",                   pPars->fPdrVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}